

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

int lws_h2_client_stream_long_poll_rxonly(lws *wsi)

{
  undefined1 *puVar1;
  bool bVar2;
  
  bVar2 = (wsi->field_0x2dc & 2) == 0;
  if (!bVar2) {
    puVar1 = &(wsi->h2).field_0x11;
    *puVar1 = *puVar1 | 0xc;
    lws_callback_on_writable(wsi);
  }
  return (int)bVar2;
}

Assistant:

int
lws_h2_client_stream_long_poll_rxonly(struct lws *wsi)
{

	if (!wsi->mux_substream)
		return 1;

	/*
	 * Elect to send an empty DATA with END_STREAM, to force the stream
	 * into HALF_CLOSED LOCAL
	 */
	wsi->h2.long_poll = 1;
	wsi->h2.send_END_STREAM = 1;

	// lws_header_table_detach(wsi, 0);

	lws_callback_on_writable(wsi);

	return 0;
}